

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

size_t Corrade::Utility::
       formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>>
                 (MutableStringView *buffer,char *format,BasicStringView<const_char> *args,
                 BasicStringView<const_char> *args_1)

{
  size_t sVar1;
  BufferFormatter formatters [3];
  
  formatters[0].size = 0xffffffffffffffff;
  formatters[0]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[1].size = 0xffffffffffffffff;
  formatters[1]._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  formatters[2].size = 0xffffffffffffffff;
  formatters[2]._fn = (_func_size_t_MutableStringView_ptr_void_ptr_int_FormatType *)0x0;
  formatters[2]._value = (void *)0x0;
  formatters[0]._value = args;
  formatters[1]._value = args_1;
  sVar1 = Implementation::formatFormatters(buffer,format,formatters,2);
  return sVar1;
}

Assistant:

std::size_t formatInto(const Containers::MutableStringView& buffer, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, format, formatters, sizeof...(args));
}